

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint64_t farmhash64_uo_with_seeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t mul_00;
  char *pcVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  long lVar11;
  char *s_00;
  uint64_t in_RCX;
  ulong uVar12;
  uint64_t in_RDX;
  ulong in_RSI;
  char *in_RDI;
  uint64_t a7;
  uint64_t a6;
  uint64_t a5;
  uint64_t a4;
  uint64_t a3;
  uint64_t a2;
  uint64_t a1;
  uint64_t a0;
  char *last64;
  char *end;
  uint64_t mul;
  uint64_t u;
  uint128_c_t w;
  uint128_c_t v;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  uint64_t in_stack_fffffffffffffee8;
  uint64_t in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  int r;
  char *in_stack_ffffffffffffff00;
  uint64_t in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  ulong local_e0;
  ulong local_68;
  uint128_c_t local_60;
  uint128_c_t local_50;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  ulong local_18;
  char *local_10;
  uint64_t local_8;
  
  if (in_RSI < 0x41) {
    local_8 = farmhash64_na_with_seeds
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                         in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else {
    local_38 = in_RCX * -0x651e95c4d06fbfb1 + 0x71;
    local_30 = in_RDX;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_40 = smix(local_38 * -0x651e95c4d06fbfb1);
    local_40 = local_40 * -0x651e95c4d06fbfb1;
    local_50 = make_uint128_c_t(local_20,local_28);
    local_60 = make_uint128_c_t(0,0);
    local_68 = local_30 - local_40;
    local_30 = local_30 * -0x651e95c4d06fbfb1;
    mul_00 = (local_68 & 0x82) + 0x9ae16a3b2f90404f;
    pcVar1 = local_10 + (local_18 - 1 & 0xffffffffffffffc0);
    uVar12 = local_18 - 1;
    if (local_10 + (local_18 - 0x40) != pcVar1 + ((uVar12 & 0x3f) - 0x3f)) {
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash-c.c"
                    ,0x1f5,
                    "uint64_t farmhash64_uo_with_seeds(const char *, size_t, uint64_t, uint64_t)");
    }
    do {
      uVar2 = fetch64(local_10);
      uVar3 = fetch64(local_10 + 8);
      uVar4 = fetch64(local_10 + 0x10);
      uVar5 = fetch64(local_10 + 0x18);
      uVar6 = fetch64(local_10 + 0x20);
      uVar7 = fetch64(local_10 + 0x28);
      uVar8 = fetch64(local_10 + 0x30);
      uVar9 = fetch64(local_10 + 0x38);
      local_30 = uVar2 + uVar3 + local_30;
      local_38 = uVar4 + local_38;
      local_40 = uVar5 + local_40;
      local_50.b = uVar7 + uVar3 + local_50.b;
      local_60.b = uVar9 + local_60.b;
      local_50.a = uVar6 + local_50.a;
      local_60.a = uVar8 + local_60.a;
      local_30 = ror64(local_30,0x1a);
      local_30 = local_30 * 9;
      local_38 = ror64(local_38,0x1d);
      local_40 = mul_00 * local_40;
      local_50.a = ror64(local_50.a,0x21);
      uVar10 = ror64(local_50.b,0x1e);
      local_60.a = (local_30 ^ local_60.a) * 9;
      local_50.b = uVar10;
      uVar10 = ror64(local_40,0x20);
      lVar11 = local_60.b + uVar10;
      local_60.b = lVar11 + local_60.b;
      local_40 = lVar11 * 9;
      swap64(&local_68,&local_38);
      local_40 = uVar2 + uVar8 + local_40;
      lVar11 = uVar3 + local_30;
      local_38 = uVar4 + local_50.a + uVar9 + local_38;
      local_50.b = uVar6 + local_60.a + uVar5 + local_50.b;
      local_50.a = (lVar11 - local_38) + uVar4 + local_50.a;
      local_60.b = (lVar11 - local_38) + uVar7 + uVar8 + local_60.b;
      local_60.a = local_50.b + uVar6 + local_60.a;
      local_30 = local_60.b + lVar11;
      uVar2 = ror64(local_60.b,0x22);
      local_60.b = uVar2;
      swap64(&local_68,&local_40);
      local_10 = local_10 + 0x40;
    } while (local_10 != pcVar1);
    local_68 = local_68 * 9;
    local_10 = pcVar1 + ((uVar12 & 0x3f) - 0x3f);
    uVar2 = ror64(local_50.b,0x1c);
    local_50.b = uVar2;
    local_50.a = ror64(local_50.a,0x14);
    local_68 = local_38 + local_68;
    local_38 = local_68 + local_38;
    lVar11 = (local_38 - local_30) + local_50.a;
    local_60.a = (local_18 - 1 & 0x3f) + local_60.a;
    uVar2 = fetch64(local_10 + 8);
    local_30 = ror64(lVar11 + uVar2,0x25);
    local_30 = local_30 * mul_00;
    uVar12 = local_38 ^ local_50.b;
    uVar2 = fetch64(local_10 + 0x30);
    local_38 = ror64(uVar12 ^ uVar2,0x2a);
    local_38 = local_38 * mul_00;
    local_30 = local_60.b * 9 ^ local_30;
    uVar2 = local_50.a;
    uVar3 = fetch64(local_10 + 0x28);
    local_38 = uVar2 + uVar3 + local_38;
    local_40 = ror64(local_40 + local_60.a,0x21);
    r = (int)(uVar2 >> 0x20);
    local_40 = local_40 * mul_00;
    local_50 = weak_farmhash_na_len_32_with_seeds
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                          (uint64_t)in_stack_ffffffffffffff00);
    pcVar1 = local_10 + 0x20;
    s_00 = (char *)(local_40 + local_60.b);
    uVar2 = local_38;
    fetch64(local_10 + 0x10);
    local_60 = weak_farmhash_na_len_32_with_seeds(s_00,(uint64_t)pcVar1,uVar2);
    local_e0 = local_60.a;
    farmhash_len_16_mul(local_50.a + local_30,local_e0 ^ local_38,mul_00);
    farmhash_uo_h((uint64_t)s_00,(uint64_t)pcVar1,uVar2,r);
    local_8 = farmhash_uo_h((uint64_t)s_00,(uint64_t)pcVar1,uVar2,r);
  }
  return local_8;
}

Assistant:

uint64_t farmhash64_uo_with_seeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhash64_na_with_seeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = smix(y * k2) * k2;
  uint128_c_t v = make_uint128_c_t(seed0, seed1);
  uint128_c_t w = make_uint128_c_t(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = fetch64(s);
    uint64_t a1 = fetch64(s + 8);
    uint64_t a2 = fetch64(s + 16);
    uint64_t a3 = fetch64(s + 24);
    uint64_t a4 = fetch64(s + 32);
    uint64_t a5 = fetch64(s + 40);
    uint64_t a6 = fetch64(s + 48);
    uint64_t a7 = fetch64(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.a += a4;
    v.b += a5 + a1;
    w.a += a6;
    w.b += a7;

    x = ror64(x, 26);
    x *= 9;
    y = ror64(y, 29);
    z *= mul;
    v.a = ror64(v.a, 33);
    v.b = ror64(v.b, 30);
    w.a ^= x;
    w.a *= 9;
    z = ror64(z, 32);
    z += w.b;
    w.b += z;
    z *= 9;
    swap64(&u, &y);

    z += a0 + a6;
    v.a += a2;
    v.b += a3;
    w.a += a4;
    w.b += a5 + a6;
    x += a1;
    y += a7;

    y += v.a;
    v.a += x - y;
    v.b += w.a;
    w.a += v.b;
    w.b += x - y;
    x += w.b;
    w.b = ror64(w.b, 34);
    swap64(&u, &z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.b = ror64(v.b, 28);
  v.a = ror64(v.a, 20);
  w.a += ((len - 1) & 63);
  u += y;
  y += u;
  x = ror64(y - x + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y ^ v.b ^ fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  return farmhash_uo_h(farmhash_len_16_mul(v.a + x, w.a ^ y, mul) + z - u,
           farmhash_uo_h(v.b + y, w.b + z, k2, 30) ^ x,
           k2,
           31);
}